

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWriteFile.cpp
# Opt level: O0

void __thiscall irr::io::CWriteFile::openFile(CWriteFile *this,bool append)

{
  u32 uVar1;
  char *__filename;
  FILE *pFVar2;
  long lVar3;
  byte in_SIL;
  long in_RDI;
  char *local_28;
  
  uVar1 = core::string<char>::size((string<char> *)0x3870c5);
  if (uVar1 == 0) {
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  else {
    __filename = core::string<char>::c_str((string<char> *)0x3870ea);
    if ((in_SIL & 1) == 0) {
      local_28 = "wb";
    }
    else {
      local_28 = "ab";
    }
    pFVar2 = fopen(__filename,local_28);
    *(FILE **)(in_RDI + 0x28) = pFVar2;
    if (*(long *)(in_RDI + 0x28) != 0) {
      fseek(*(FILE **)(in_RDI + 0x28),0,2);
      lVar3 = ftell(*(FILE **)(in_RDI + 0x28));
      *(long *)(in_RDI + 0x30) = lVar3;
      fseek(*(FILE **)(in_RDI + 0x28),0,0);
    }
  }
  return;
}

Assistant:

void CWriteFile::openFile(bool append)
{
	if (Filename.size() == 0) {
		File = 0;
		return;
	}

	File = fopen(Filename.c_str(), append ? "ab" : "wb");

	if (File) {
		// get FileSize

		fseek(File, 0, SEEK_END);
		FileSize = ftell(File);
		fseek(File, 0, SEEK_SET);
	}
}